

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

bool __thiscall Time::operator!=(Time *this,Time *other)

{
  bool local_19;
  Time *other_local;
  Time *this_local;
  
  local_19 = true;
  if ((((((this->sec == other->sec) && (local_19 = true, this->min == other->min)) &&
        (local_19 = true, this->hour == other->hour)) &&
       ((local_19 = true, this->day == other->day && (local_19 = true, this->month == other->month))
       )) && ((local_19 = true, this->year == other->year &&
              ((local_19 = true, this->wday == other->wday &&
               (local_19 = true, this->yday == other->yday)))))) &&
     (local_19 = true, (this->dst & 1U) == (other->dst & 1U))) {
    local_19 = (this->utc & 1U) != (other->utc & 1U);
  }
  return local_19;
}

Assistant:

bool Time::operator!=(const Time& other) const
{
  return sec != other.sec ||
    min != other.min ||
    hour != other.hour ||
    day != other.day ||
    month != other.month ||
    year != other.year ||
    wday != other.wday ||
    yday != other.yday ||
    dst != other.dst ||
    utc != other.utc;
}